

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O3

string * __thiscall
soul::getInitialiserValue_abi_cxx11_(string *__return_storage_ptr__,soul *this,CodeLocation name)

{
  Ptr PVar1;
  SourceCodeText *oldObject;
  string *extraout_RAX;
  SourceCodeText *pSVar2;
  CodeLocationRange range;
  CodeLocationRange local_88;
  SourceCodeText *local_60;
  char *local_58;
  CodeLocation local_50;
  string local_40;
  CodeLocation local_20;
  
  local_20.location.data = (char *)name.sourceCode.object;
  local_88.end.sourceCode.object = (SourceCodeText *)0x0;
  local_88.end.location.data = (char *)0x0;
  local_88.start.sourceCode.object = (SourceCodeText *)0x0;
  local_88.start.location.data = (char *)0x0;
  if (this != (soul *)0x0) {
    *(int *)this = *(int *)this + 1;
  }
  local_20.sourceCode.object = (SourceCodeText *)this;
  SourceCodeUtilities::findNextOccurrence((SourceCodeUtilities *)&local_60,&local_20,'=');
  PVar1.object = local_88.start.sourceCode.object;
  pSVar2 = local_60;
  if (local_60 != local_88.start.sourceCode.object) {
    local_88.start.sourceCode.object = local_60;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(PVar1.object);
    pSVar2 = (SourceCodeText *)0x0;
  }
  local_88.start.location.data = local_58;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar2);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)this);
  if ((local_88.start.sourceCode.object != (SourceCodeText *)0x0) &&
     (((local_88.start.sourceCode.object)->content)._M_string_length != 0)) {
    UTF8Reader::operator++(&local_88.start.location);
    local_50.sourceCode.object = local_88.start.sourceCode.object;
    if (local_88.start.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_88.start.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_88.start.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_50.location.data = local_88.start.location.data;
    SourceCodeUtilities::findEndOfExpression((SourceCodeUtilities *)&local_60,&local_50);
    PVar1.object = local_88.end.sourceCode.object;
    pSVar2 = local_60;
    if (local_60 != local_88.end.sourceCode.object) {
      local_88.end.sourceCode.object = local_60;
      local_60 = (SourceCodeText *)0x0;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(PVar1.object);
      pSVar2 = (SourceCodeText *)0x0;
    }
    local_88.end.location.data = local_58;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar2);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_50.sourceCode.object);
    CodeLocationRange::toString_abi_cxx11_(&local_40,&local_88);
    choc::text::trim(__return_storage_ptr__,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_88.end.sourceCode.object);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_88.start.sourceCode.object);
    return extraout_RAX;
  }
  throwInternalCompilerError("! range.start.isEmpty()","getInitialiserValue",0x111);
}

Assistant:

static std::string getInitialiserValue (CodeLocation name)
{
    CodeLocationRange range;
    range.start = SourceCodeUtilities::findNextOccurrence (name, '=');
    SOUL_ASSERT (! range.start.isEmpty());
    ++(range.start.location);
    range.end = SourceCodeUtilities::findEndOfExpression (range.start);
    return choc::text::trim (range.toString());
}